

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DefineObjectNameComputed(JSContext *ctx,JSValue obj,JSValue str,int flags)

{
  JSValue v;
  JSValue obj_00;
  JSValue val;
  JSValue val_00;
  int iVar1;
  BOOL BVar2;
  JSAtom JVar3;
  int64_t in_RCX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  JSValue JVar4;
  JSValue in_stack_00000000;
  JSValue name_str;
  JSAtom prop;
  JSAtom in_stack_ffffffffffffff9c;
  JSContext *in_stack_ffffffffffffffa0;
  int64_t local_50;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar5;
  JSAtom in_stack_ffffffffffffffbc;
  undefined4 uVar6;
  JSContext *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  JSAtom prop_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  prop_00 = (JSAtom)((ulong)in_R8 >> 0x20);
  JVar4.tag = in_RDX;
  JVar4.u.float64 = in_RSI.float64;
  iVar1 = JS_IsObject(JVar4);
  if ((iVar1 != 0) &&
     (obj_00.tag._0_4_ = in_stack_ffffffffffffffc8, obj_00.u.ptr = in_stack_ffffffffffffffc0,
     obj_00.tag._4_4_ = in_R9D,
     BVar2 = js_object_has_name((JSContext *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),obj_00
                               ), BVar2 == 0)) {
    val.tag = in_RCX;
    val.u.float64 = in_RDI.float64;
    JVar3 = JS_ValueToAtom((JSContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),val);
    if (JVar3 == 0) {
      return -1;
    }
    JVar4 = js_get_function_name(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    uVar5 = JVar4.u._0_4_;
    uVar6 = JVar4.u._4_4_;
    local_50 = JVar4.tag;
    JS_FreeAtom(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    v.u._4_4_ = uVar6;
    v.u.int32 = uVar5;
    v.tag = local_50;
    iVar1 = JS_IsException(v);
    if (iVar1 != 0) {
      return -1;
    }
    val_00.tag._0_4_ = in_stack_fffffffffffffff8;
    val_00.u = (JSValueUnion)in_RDX;
    val_00.tag._4_4_ = in_stack_fffffffffffffffc;
    iVar1 = JS_DefinePropertyValue
                      ((JSContext *)in_RSI.ptr,in_stack_00000000,prop_00,val_00,name_str.u.int32);
    if (iVar1 < 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int JS_DefineObjectNameComputed(JSContext *ctx, JSValueConst obj,
                                       JSValueConst str, int flags)
{
    if (JS_IsObject(obj) &&
        !js_object_has_name(ctx, obj)) {
        JSAtom prop;
        JSValue name_str;
        prop = JS_ValueToAtom(ctx, str);
        if (prop == JS_ATOM_NULL)
            return -1;
        name_str = js_get_function_name(ctx, prop);
        JS_FreeAtom(ctx, prop);
        if (JS_IsException(name_str))
            return -1;
        if (JS_DefinePropertyValue(ctx, obj, JS_ATOM_name, name_str, flags) < 0)
            return -1;
    }
    return 0;
}